

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O2

char * apprun_resolve_file_from_path_env(char *filename)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t __n;
  char *pcVar5;
  char resolved [4096];
  char search_paths [4096];
  
  pcVar5 = search_paths;
  memset(pcVar5,0,0x1000);
  memset(resolved,0,0x1000);
  pcVar3 = getenv("PATH");
  if (pcVar3 == (char *)0x0) {
    confstr(0,search_paths,0x1000);
  }
  else {
    strcpy(search_paths,pcVar3);
  }
  sVar4 = strlen(filename);
  while( true ) {
    cVar1 = *pcVar5;
    do {
      if (cVar1 == '\0') goto LAB_00104ba8;
      pcVar3 = strchrnul(pcVar5,0x3a);
      __n = (long)pcVar3 - (long)pcVar5;
    } while (__n == 0);
    strncpy(resolved,pcVar5,__n);
    resolved[__n] = '/';
    strncpy(resolved + __n + 1,filename,sVar4 & 0xffffffff);
    resolved[__n + (sVar4 & 0xffffffff) + 1] = '\0';
    iVar2 = access(resolved,0);
    if (iVar2 == 0) break;
    pcVar5 = pcVar3 + 1;
  }
  filename = resolved;
LAB_00104ba8:
  pcVar5 = strdup(filename);
  return pcVar5;
}

Assistant:

char* apprun_resolve_file_from_path_env(const char* filename) {
    char search_paths[PATH_MAX] = {0x0};
    char resolved[PATH_MAX] = {0x0};

    // use PATH env or fallback to confstr(_CS_PATH)
    char* path_env = getenv("PATH");
    if (path_env != NULL)
        strcpy(search_paths, path_env);
    else
        confstr(_CS_PATH, search_paths, PATH_MAX);

    unsigned filename_len = strlen(filename);

    char* itr_begin = search_paths;
    char* itr_end = NULL;
    while (itr_begin != NULL && *itr_begin != '\0') {
        itr_end = strchrnul(itr_begin, ':');
        size_t path_len = itr_end - itr_begin;
        if (path_len > 0) {
            strncpy(resolved, itr_begin, path_len);
            resolved[path_len] = '/';
            strncpy(resolved + path_len + 1, filename, filename_len);
            resolved[path_len + filename_len + 1] = '\0';

            if (access(resolved, F_OK) == 0)
                return strdup(resolved);

            itr_begin = itr_end + 1;
        }
    }

    return strdup(filename);
}